

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O1

void __thiscall
DP::SimpleCongruenceClosure::getUnsatCore
          (SimpleCongruenceClosure *this,LiteralStack *res,uint coreIndex)

{
  CEq *pCVar1;
  Literal *pLVar2;
  ConstInfo *pCVar3;
  ConstInfo *pCVar4;
  CPair CVar5;
  CPair CVar6;
  int iVar7;
  int iVar8;
  pair<unsigned_int,_unsigned_int> **pppVar9;
  pair<unsigned_int,_unsigned_int> pVar10;
  uint uVar11;
  uint uVar12;
  IntUnionFind explained;
  IntUnionFind local_68;
  
  pCVar1 = (this->_unsatEqs)._stack;
  uVar11 = pCVar1[coreIndex].c1;
  uVar12 = pCVar1[coreIndex].c2;
  pLVar2 = pCVar1[coreIndex].foPremise;
  if (pLVar2 != (Literal *)0x0) {
    if (res->_cursor == res->_end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(res);
    }
    *res->_cursor = pLVar2;
    res->_cursor = res->_cursor + 1;
  }
  if (getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain == '\0') {
    getUnsatCore();
  }
  pVar10.second = uVar12;
  pVar10.first = uVar11;
  if (getUnsatCore::toExplain._cursor == getUnsatCore::toExplain._end) {
    ::Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand(&getUnsatCore::toExplain);
  }
  *getUnsatCore::toExplain._cursor = pVar10;
  getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + 1;
  ::Lib::IntUnionFind::IntUnionFind(&local_68,(int)(this->_cInfos)._size);
  if (getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack == '\0') {
    getUnsatCore();
  }
  if (getUnsatCore::toExplain._cursor != getUnsatCore::toExplain._stack) {
    do {
      pVar10 = getUnsatCore::toExplain._cursor[-1];
      uVar12 = pVar10.first;
      getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + -1;
      iVar7 = ::Lib::IntUnionFind::root(&local_68,uVar12);
      uVar11 = pVar10.second;
      iVar8 = ::Lib::IntUnionFind::root(&local_68,uVar11);
      if (iVar7 != iVar8) {
        getUnsatCore::pathStack._cursor = getUnsatCore::pathStack._stack;
        collectUnifyingPath(this,uVar12,uVar11,&getUnsatCore::pathStack);
        while (getUnsatCore::pathStack._cursor != getUnsatCore::pathStack._stack) {
          uVar11 = getUnsatCore::pathStack._cursor[-1];
          pCVar3 = (this->_cInfos)._array;
          getUnsatCore::pathStack._cursor = getUnsatCore::pathStack._cursor + -1;
          iVar7 = ::Lib::IntUnionFind::root(&local_68,pCVar3[uVar11].predecessorPremise.c1);
          iVar8 = ::Lib::IntUnionFind::root(&local_68,pCVar3[uVar11].predecessorPremise.c2);
          if (iVar7 != iVar8) {
            if (pCVar3[uVar11].predecessorPremise.foOrigin == true) {
              pLVar2 = pCVar3[uVar11].predecessorPremise.foPremise;
              if (pLVar2 != (Literal *)0x0) {
                if (res->_cursor == res->_end) {
                  ::Lib::Stack<Kernel::Literal_*>::expand(res);
                }
                *res->_cursor = pLVar2;
                pppVar9 = (pair<unsigned_int,_unsigned_int> **)&res->_cursor;
                goto LAB_00284b79;
              }
            }
            else {
              pCVar4 = (this->_cInfos)._array;
              CVar5 = pCVar4[pCVar3[uVar11].predecessorPremise.c1].namedPair;
              CVar6 = pCVar4[pCVar3[uVar11].predecessorPremise.c2].namedPair;
              if (getUnsatCore::toExplain._cursor == getUnsatCore::toExplain._end) {
                ::Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand
                          (&getUnsatCore::toExplain);
              }
              *getUnsatCore::toExplain._cursor =
                   (pair<unsigned_int,_unsigned_int>)
                   ((ulong)CVar5 & 0xffffffff | (long)CVar6 << 0x20);
              getUnsatCore::toExplain._cursor = getUnsatCore::toExplain._cursor + 1;
              if (getUnsatCore::toExplain._cursor == getUnsatCore::toExplain._end) {
                ::Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand
                          (&getUnsatCore::toExplain);
              }
              *getUnsatCore::toExplain._cursor =
                   (pair<unsigned_int,_unsigned_int>)
                   ((ulong)CVar6 & 0xffffffff00000000 | (ulong)CVar5 >> 0x20);
              pppVar9 = &getUnsatCore::toExplain._cursor;
LAB_00284b79:
              *pppVar9 = *pppVar9 + 1;
            }
            ::Lib::IntUnionFind::doUnion
                      (&local_68,pCVar3[uVar11].predecessorPremise.c1,
                       pCVar3[uVar11].predecessorPremise.c2);
          }
        }
      }
    } while (getUnsatCore::toExplain._cursor != getUnsatCore::toExplain._stack);
  }
  ::Lib::IntUnionFind::~IntUnionFind(&local_68);
  return;
}

Assistant:

void SimpleCongruenceClosure::getUnsatCore(LiteralStack& res, unsigned coreIndex)
{
  ASS(res.isEmpty());
  ASS_L(coreIndex,_unsatEqs.size());

  CEq unsatEq = _unsatEqs[coreIndex];

  ASS(unsatEq.foOrigin);
  if(unsatEq.foPremise) {
    res.push(unsatEq.foPremise);
  }

  static Stack<CPair> toExplain;
  toExplain.push(CPair(unsatEq.c1, unsatEq.c2));
  ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));

  IntUnionFind explained(getMaxConst()+1);
  static Stack<unsigned> pathStack;

  while(toExplain.isNonEmpty()) {
    CPair curr = toExplain.pop();
    ASS_EQ(deref(curr.first), deref(curr.second));

    if(explained.root(curr.first)==explained.root(curr.second)) {
      //we've already explained this equality
      continue;
    }
    pathStack.reset();
    // put into pathStack constants whose premises imply the equality
    collectUnifyingPath(curr.first, curr.second, pathStack);
    while(pathStack.isNonEmpty()) {
      unsigned proofStepConst = pathStack.pop();
      CEq& prem = _cInfos[proofStepConst].predecessorPremise;
      if(explained.root(prem.c1)==explained.root(prem.c2)) {
        //we've already explained this equality
        continue;
      }
      if(prem.foOrigin) {
	if(prem.foPremise) {
	  res.push(prem.foPremise);
	} // Martin: this should be only null for the "built-in" dis-equality (_posLitConst != _negLitConst)
      }
      else {
	//the equality was implied by congruence between the following two pairs:
	CPair cp1 = _cInfos[prem.c1].namedPair;
	CPair cp2 = _cInfos[prem.c2].namedPair;
	ASS_NEQ(cp1.first,0);
	ASS_NEQ(cp1.second,0);
	ASS_NEQ(cp2.first,0);
	ASS_NEQ(cp2.second,0);
	toExplain.push(CPair(cp1.first, cp2.first));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
	toExplain.push(CPair(cp1.second, cp2.second));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
      }
      explained.doUnion(prem.c1, prem.c2);
    }
  }
}